

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_voice.c
# Opt level: O0

ALLEGRO_VOICE * al_create_voice(uint freq,ALLEGRO_AUDIO_DEPTH depth,ALLEGRO_CHANNEL_CONF chan_conf)

{
  int iVar1;
  ALLEGRO_MUTEX *pAVar2;
  ALLEGRO_COND *pAVar3;
  _AL_LIST_ITEM *p_Var4;
  ALLEGRO_CHANNEL_CONF in_EDX;
  ALLEGRO_AUDIO_DEPTH in_ESI;
  uint in_EDI;
  ALLEGRO_VOICE *voice;
  char *in_stack_ffffffffffffffd8;
  ALLEGRO_VOICE *local_8;
  
  if (in_EDI == 0) {
    _al_set_error(0,in_stack_ffffffffffffffd8);
    local_8 = (ALLEGRO_VOICE *)0x0;
  }
  else {
    local_8 = (ALLEGRO_VOICE *)
              al_calloc_with_context
                        (1,0x58,0x4b,
                         "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_voice.c"
                         ,"al_create_voice");
    if (local_8 == (ALLEGRO_VOICE *)0x0) {
      local_8 = (ALLEGRO_VOICE *)0x0;
    }
    else {
      local_8->depth = in_ESI;
      local_8->chan_conf = in_EDX;
      local_8->frequency = in_EDI;
      pAVar2 = (ALLEGRO_MUTEX *)al_create_mutex();
      local_8->mutex = pAVar2;
      pAVar3 = (ALLEGRO_COND *)al_create_cond();
      local_8->cond = pAVar3;
      local_8->driver = _al_kcm_driver;
      iVar1 = (*_al_kcm_driver->allocate_voice)(local_8);
      if (iVar1 == 0) {
        p_Var4 = _al_kcm_register_destructor
                           ((char *)local_8,in_stack_ffffffffffffffd8,
                            (_func_void_void_ptr *)0x111a6a);
        local_8->dtor_item = p_Var4;
      }
      else {
        al_destroy_mutex(local_8->mutex);
        al_destroy_cond(local_8->cond);
        al_free_with_context
                  (local_8,0x5d,
                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/kcm_voice.c"
                   ,"al_create_voice");
        local_8 = (ALLEGRO_VOICE *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

ALLEGRO_VOICE *al_create_voice(unsigned int freq,
   ALLEGRO_AUDIO_DEPTH depth, ALLEGRO_CHANNEL_CONF chan_conf)
{
   ALLEGRO_VOICE *voice = NULL;

   if (!freq) {
      _al_set_error(ALLEGRO_INVALID_PARAM, "Invalid Voice Frequency");
      return NULL;
   }

   voice = al_calloc(1, sizeof(*voice));
   if (!voice) {
      return NULL;
   }

   voice->depth     = depth;
   voice->chan_conf = chan_conf;
   voice->frequency = freq;

   voice->mutex = al_create_mutex();
   voice->cond = al_create_cond();
   /* XXX why is this needed? there should only be one active driver */
   voice->driver = _al_kcm_driver;

   ASSERT(_al_kcm_driver);
   if (_al_kcm_driver->allocate_voice(voice) != 0) {
      al_destroy_mutex(voice->mutex);
      al_destroy_cond(voice->cond);
      al_free(voice);
      return NULL;
   }

   voice->dtor_item = _al_kcm_register_destructor("voice", voice,
      (void (*)(void *)) al_destroy_voice);

   return voice;
}